

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_NodeAddToClass(Ivy_Obj_t *pClass,Ivy_Obj_t *pObj)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pObj_local;
  Ivy_Obj_t *pClass_local;
  
  pIVar1 = Ivy_ObjClassNodeNext(pClass);
  if (pIVar1 == (Ivy_Obj_t *)0x0) {
    Ivy_ObjSetClassNodeNext(pClass,pObj);
  }
  else {
    pIVar1 = Ivy_ObjClassNodeLast(pClass);
    Ivy_ObjSetClassNodeNext(pIVar1,pObj);
  }
  Ivy_ObjSetClassNodeLast(pClass,pObj);
  Ivy_ObjSetClassNodeRepr(pObj,pClass);
  Ivy_ObjSetClassNodeNext(pObj,(Ivy_Obj_t *)0x0);
  return;
}

Assistant:

void Ivy_NodeAddToClass( Ivy_Obj_t * pClass, Ivy_Obj_t * pObj )
{
    if ( Ivy_ObjClassNodeNext(pClass) == NULL )
        Ivy_ObjSetClassNodeNext( pClass, pObj );
    else
        Ivy_ObjSetClassNodeNext( Ivy_ObjClassNodeLast(pClass), pObj );
    Ivy_ObjSetClassNodeLast( pClass, pObj );
    Ivy_ObjSetClassNodeRepr( pObj, pClass );
    Ivy_ObjSetClassNodeNext( pObj, NULL );
}